

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_reserve_success_enoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.buffer = (char *)0x0;
  string.size = 3;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x11fd25;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x11fd55;
  bVar1 = AString_reserve(&string,0);
  if (bVar1 == false) {
    pcVar3 = "Assertion \'AString_reserve(&string, 0)\' failed";
    iVar2 = 0x13b;
LAB_001202b9:
    uStack_50 = 0x1202c5;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar3,0,0);
  }
  uStack_50 = 0x11fd6e;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x13b);
  if (string.capacity == 0x10) {
    uStack_50 = 0x11fd8e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x13c);
    if (string.buffer == (char *)0x0) {
      ppcVar6 = &local_58;
      pcVar4 = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar10 = "(void*) (string).buffer";
      iVar2 = 0x13c;
      goto LAB_00120417;
    }
    uStack_50 = 0x11fdab;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x13c);
    pcVar3 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar3 = "(null)";
    }
    else {
      uStack_50 = 0x11fdcb;
      iVar2 = strcmp("012",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x11fde4;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x13c);
        if (string.size != 3) {
          iVar2 = 0x13c;
          goto LAB_001203c4;
        }
        uStack_50 = 0x11fe04;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x13c);
        if (private_ACUtilsTest_AString_reallocCount != 0) {
          ppcVar6 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar10 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x13d;
LAB_00120417:
          uStack_50 = 0;
          local_58 = (char *)0x0;
          *(code **)((long)ppcVar6 + -8) = test_AString_reserve_success_notEnoughCapacity_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,iVar2,pcVar4,pcVar3,pcVar8,pcVar10);
        }
        uStack_50 = 0x11fe25;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x13d);
        uStack_50 = 0x11fe32;
        bVar1 = AString_reserve(&string,1);
        if (bVar1 == false) {
          pcVar3 = "Assertion \'AString_reserve(&string, 1)\' failed";
          iVar2 = 0x13e;
          goto LAB_001202b9;
        }
        uStack_50 = 0x11fe4b;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x13e);
        if (string.capacity != 0x10) {
          iVar2 = 0x13f;
          goto LAB_001202f4;
        }
        uStack_50 = 0x11fe6b;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x13f);
        if (string.buffer == (char *)0x0) {
          ppcVar6 = &local_58;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) (string).buffer != NULL";
          pcVar10 = "(void*) (string).buffer";
          iVar2 = 0x13f;
          goto LAB_00120417;
        }
        uStack_50 = 0x11fe88;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x13f);
        pcVar3 = string.buffer;
        if (string.buffer == (char *)0x0) {
          pcVar4 = "";
          pcVar3 = "(null)";
        }
        else {
          uStack_50 = 0x11fea8;
          iVar2 = strcmp("012",string.buffer);
          if (iVar2 == 0) {
            uStack_50 = 0x11fec1;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x13f);
            if (string.size == 3) {
              uStack_50 = 0x11fee1;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x13f);
              if (private_ACUtilsTest_AString_reallocCount != 0) {
                ppcVar6 = &local_68;
                local_60 = "(0)";
                local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
                pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
                pcVar10 = "private_ACUtilsTest_AString_reallocCount";
                iVar2 = 0x140;
                goto LAB_00120417;
              }
              uStack_50 = 0x11ff02;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x140);
              uStack_50 = 0x11ff0f;
              bVar1 = AString_reserve(&string,0x10);
              if (bVar1 == false) {
                pcVar3 = "Assertion \'AString_reserve(&string, 16)\' failed";
                iVar2 = 0x141;
                goto LAB_001202b9;
              }
              uStack_50 = 0x11ff28;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x141);
              if (string.capacity != 0x10) {
                iVar2 = 0x142;
                goto LAB_001202f4;
              }
              uStack_50 = 0x11ff48;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x142);
              if (string.buffer == (char *)0x0) {
                ppcVar6 = &local_58;
                pcVar4 = "Assertion \'_ck_x != NULL\' failed";
                pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                pcVar8 = "(void*) (string).buffer != NULL";
                pcVar10 = "(void*) (string).buffer";
                iVar2 = 0x142;
                goto LAB_00120417;
              }
              uStack_50 = 0x11ff65;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x142);
              pcVar3 = string.buffer;
              if (string.buffer == (char *)0x0) {
                pcVar3 = "(null)";
                pcVar4 = "";
              }
              else {
                uStack_50 = 0x11ff82;
                iVar2 = strcmp("012",string.buffer);
                if (iVar2 == 0) {
                  uStack_50 = 0x11ff9b;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x142);
                  if (string.size == 3) {
                    uStack_50 = 0x11ffbb;
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x142);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      uStack_50 = 0x11ffdc;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x143);
                      uStack_50 = 0x11ffe5;
                      (*string.deallocator)(string.buffer);
                      return;
                    }
                    ppcVar6 = &local_68;
                    local_60 = "(0)";
                    local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
                    pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar10 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x143;
                    goto LAB_00120417;
                  }
                  iVar2 = 0x142;
                  goto LAB_001203c4;
                }
                pcVar4 = "\"";
              }
              pcVar10 = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar7 = "(string).buffer == (\"012\")";
              pcVar9 = "(string).buffer";
              iVar2 = 0x142;
              local_58 = "\"";
              local_60 = "012";
              local_68 = "\"";
              pcStack_70 = "(\"012\")";
              ppcVar5 = &pcStack_80;
              pcStack_80 = pcVar3;
              pcStack_78 = pcVar4;
              goto LAB_001203cc;
            }
            iVar2 = 0x13f;
LAB_001203c4:
            local_60 = "strlen(\"012\")";
            pcVar9 = "(string).size";
            pcVar7 = "(string).size == strlen(\"012\")";
            local_58 = (char *)0x3;
            pcVar4 = (char *)string.size;
            goto LAB_001203ca;
          }
          pcVar4 = "\"";
        }
        pcVar10 = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar7 = "(string).buffer == (\"012\")";
        pcVar9 = "(string).buffer";
        iVar2 = 0x13f;
        local_58 = "\"";
        local_60 = "012";
        local_68 = "\"";
        pcStack_70 = "(\"012\")";
        ppcVar5 = &pcStack_80;
        pcStack_80 = pcVar3;
        pcStack_78 = pcVar4;
        goto LAB_001203cc;
      }
      pcVar4 = "\"";
    }
    pcVar10 = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar7 = "(string).buffer == (\"012\")";
    pcVar9 = "(string).buffer";
    iVar2 = 0x13c;
    local_58 = "\"";
    local_60 = "012";
    local_68 = "\"";
    pcStack_70 = "(\"012\")";
    ppcVar5 = &pcStack_80;
    pcStack_80 = pcVar3;
    pcStack_78 = pcVar4;
  }
  else {
    iVar2 = 0x13c;
LAB_001202f4:
    local_60 = "(16)";
    pcVar9 = "(string).capacity";
    pcVar7 = "(string).capacity == (16)";
    local_58 = (char *)0x10;
    pcVar4 = (char *)string.capacity;
LAB_001203ca:
    pcVar10 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
  }
LAB_001203cc:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x1203d3;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,pcVar10,pcVar8,pcVar7,pcVar9);
}

Assistant:

START_TEST(test_AString_reserve_success_enoughCapacity)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012", 16);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 1));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 16));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}